

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  IStreamingReporter *pIVar1;
  bool _aborting;
  TestRunStats *this_00;
  TestRunStats local_80;
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_00190440;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&PTR__RunContext_00190520;
  pIVar1 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  _aborting = aborting(this);
  TestRunStats::TestRunStats(&local_80,&this->m_runInfo,&this->m_totals,_aborting);
  (*pIVar1->_vptr_IStreamingReporter[0x12])(pIVar1,&local_80);
  this_00 = &local_80;
  TestRunStats::~TestRunStats(this_00);
  FatalConditionHandler::~FatalConditionHandler((FatalConditionHandler *)this_00);
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_trackerContext).m_rootTracker.
              super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  clara::std::
  _Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::~_Vector_base(&(this->m_activeSections).
                   super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                 );
  clara::std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::~vector
            (&this->m_unfinishedSections);
  clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::~vector
            (&this->m_messageScopes);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&this->m_messages);
  clara::std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  ::~unique_ptr(&this->m_reporter);
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Option<Catch::AssertionResult>::reset(&this->m_lastResult);
  std::__cxx11::string::~string((string *)&this->m_runInfo);
  return;
}

Assistant:

RunContext::~RunContext() {
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, aborting()));
    }